

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int Cloak_off(void)

{
  short sVar1;
  uint uVar2;
  char *pcVar3;
  char *line;
  
  if (uarmc == (obj *)0x0) {
    return 0;
  }
  sVar1 = uarmc->otyp;
  uVar2 = u.uprops[objects[sVar1].oc_oprop].extrinsic;
  Oprops_off(uarmc,2);
  takeoff_mask = takeoff_mask & 0xfffffffd;
  setworn((obj *)0x0,2);
  switch(sVar1) {
  case 0x7c:
    if ((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
        (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) {
      return 0;
    }
    if (u.uprops[0xd].blocked != 0) {
      return 0;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00183674;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018366f;
    }
    else {
LAB_0018366f:
      if (ublindf == (obj *)0x0) {
        return 0;
      }
LAB_00183674:
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
    }
    newsym((int)u.ux,(int)u.uy);
    if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
      pcVar3 = "see through yourself";
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        pcVar3 = "no longer see yourself";
      }
    }
    else {
      pcVar3 = "see through yourself";
    }
    line = "You can %s.";
    goto LAB_0018381a;
  case 0x7d:
    if ((((uVar2 & 0xfffffffd) == 0) && (u.uprops[0x13].intrinsic == 0)) &&
       (u.uprops[0x13].blocked == 0)) {
      discover_object(0x7d,'\x01','\x01');
      pline("You sure are noisy.");
    }
    break;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x83:
  case 0x84:
  case 0x86:
  case 0x87:
    break;
  case 0x82:
    u.uprops[7].extrinsic._0_1_ = (byte)u.uprops[7].extrinsic & 0xfd;
    break;
  case 0x85:
    if ((uVar2 & 0xfffffffd) != 0 || u.uprops[0xd].intrinsic != 0) {
      return 0;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001836ae;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001836a5;
    }
    else {
LAB_001836a5:
      if (ublindf == (obj *)0x0) {
        return 0;
      }
LAB_001836ae:
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
    }
    discover_object(0x85,'\x01','\x01');
    newsym((int)u.ux,(int)u.uy);
    if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
      pcVar3 = "no longer see through yourself";
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        pcVar3 = "see yourself";
      }
    }
    else {
      pcVar3 = "no longer see through yourself";
    }
    line = "Suddenly you can %s.";
LAB_0018381a:
    pline(line,pcVar3);
    break;
  default:
    warning("Unknown type of %s (%d)","cloak",(ulong)(uint)(int)sVar1);
  }
  return 0;
}

Assistant:

int Cloak_off(void)
{
    int otyp;
    long oldprop;

    if (!uarmc) return 0;

    otyp = uarmc->otyp;
    oldprop = u.uprops[objects[otyp].oc_oprop].extrinsic & ~WORN_CLOAK;

    Oprops_off(uarmc, WORN_CLOAK);

    takeoff_mask &= ~W_ARMC;
	/* For mummy wrapping, taking it off first resets `Invisible'. */
    setworn(NULL, W_ARMC);
    switch (otyp) {
	case ORCISH_CLOAK:
	case DWARVISH_CLOAK:
	case CLOAK_OF_PROTECTION:
	case CLOAK_OF_MAGIC_RESISTANCE:
	case CLOAK_OF_DISPLACEMENT:
	case OILSKIN_CLOAK:
	case ROBE:
	case LEATHER_CLOAK:
		break;
	case ELVEN_CLOAK:
		if (!oldprop && !HStealth && !BStealth) {
		    makeknown(otyp);
		    pline("You sure are noisy.");
		}
		break;
	case MUMMY_WRAPPING:
		if (Invis && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("You can %s.",
			See_invisible ? "see through yourself"
			: "no longer see yourself");
		}
		break;
	case CLOAK_OF_INVISIBILITY:
		if (!oldprop && !HInvis && !Blind) {
		    makeknown(CLOAK_OF_INVISIBILITY);
		    newsym(u.ux,u.uy);
		    pline("Suddenly you can %s.",
			See_invisible ? "no longer see through yourself"
			: see_yourself);
		}
		break;
	/* Alchemy smock gives poison _and_ acid resistance */
	case ALCHEMY_SMOCK:
		EAcid_resistance &= ~WORN_CLOAK;
		break;
	default: warning(unknown_type, c_cloak, otyp);
    }
    return 0;
}